

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::NotCurrentSurfaceTest::iterate(NotCurrentSurfaceTest *this)

{
  ostringstream *poVar1;
  EGLDisplay pvVar2;
  TestLog *log;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  EGLBoolean EVar6;
  Library *egl;
  EGLConfig pvVar7;
  undefined4 extraout_var;
  allocator<char> local_266;
  allocator<char> local_265;
  int bufferAge;
  string local_260;
  CallLogWrapper wrapper;
  EGLint damageRegion [4];
  ScopedLogSection local_210;
  ScopedLogSection local_208;
  ScopedLogSection local_200;
  ScopedLogSection local_1f8;
  ScopedLogSection local_1f0;
  ScopedLogSection local_1e8;
  UniqueSurface dummyPbuffer;
  undefined1 local_1c8 [384];
  EGLint attribList [5];
  
  egl = EglTestContext::getLibrary
                  ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  pvVar7 = getEGLConfig(egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,SURFACETYPE_PBUFFER
                        ,false);
  attribList[0] = 0x3057;
  attribList[1] = 0x40;
  attribList[2] = 0x3056;
  attribList[3] = 0x40;
  attribList[4] = 0x3038;
  pvVar2 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  iVar4 = (*egl->_vptr_Library[10])(egl,pvVar2,pvVar7);
  eglu::UniqueSurface::UniqueSurface
            (&dummyPbuffer,egl,pvVar2,(EGLSurface)CONCAT44(extraout_var,iVar4));
  log = ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  eglu::CallLogWrapper::CallLogWrapper(&wrapper,egl,log);
  damageRegion[0] = 10;
  damageRegion[1] = 10;
  damageRegion[2] = 10;
  damageRegion[3] = 10;
  bufferAge = -0x65e4;
  wrapper.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  (*egl->_vptr_Library[0x27])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,dummyPbuffer.m_surface,
             dummyPbuffer.m_surface,(this->super_NegativePartialUpdateTest).m_eglContext);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x122);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"Test2.1",&local_265);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,
             "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE"
             ,&local_266);
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,log,(string *)local_1c8,&local_260);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1e8);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)local_1c8);
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x125);
  EVar6 = eglu::CallLogWrapper::eglQuerySurface
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&bufferAge);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar6);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x300d);
  if (bufferAge != -0x65e4) {
    poVar1 = (ostringstream *)(local_1c8 + 8);
    local_1c8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "On failure, eglQuerySurface shouldn\'t change buffer age but buffer age has been changed to "
                   );
    std::ostream::operator<<(poVar1,bufferAge);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail, bufferAge shouldn\'t be changed");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"Test2.2",&local_265);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_266);
  tcu::ScopedLogSection::ScopedLogSection(&local_1f0,log,(string *)local_1c8,&local_260);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1f0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)local_1c8);
  EVar6 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar6);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  (*egl->_vptr_Library[0x27])(egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,0);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x135);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"Test3.1",&local_265);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,
             "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE"
             ,&local_266);
  tcu::ScopedLogSection::ScopedLogSection(&local_1f8,log,(string *)local_1c8,&local_260);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1f8);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)local_1c8);
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x138);
  EVar6 = eglu::CallLogWrapper::eglQuerySurface
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&bufferAge);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar6);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x300d);
  if (bufferAge != -0x65e4) {
    poVar1 = (ostringstream *)(local_1c8 + 8);
    local_1c8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "On failure, eglQuerySurface shouldn\'t change buffer age but buffer age has been changed to "
                   );
    std::ostream::operator<<(poVar1,bufferAge);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail, bufferAge shouldn\'t be changed");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"Test3.2",&local_265);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_266);
  tcu::ScopedLogSection::ScopedLogSection(&local_200,log,(string *)local_1c8,&local_260);
  tcu::ScopedLogSection::~ScopedLogSection(&local_200);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)local_1c8);
  EVar6 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar6);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  pvVar2 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"EGL_KHR_surfaceless_context",(allocator<char> *)&local_260);
  bVar3 = eglu::hasExtension(egl,pvVar2,(string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar3) {
    (*egl->_vptr_Library[0x27])
              (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,
               (this->super_NegativePartialUpdateTest).m_eglContext);
    dVar5 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x14a);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"Test4.1",&local_265);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE"
               ,&local_266);
    tcu::ScopedLogSection::ScopedLogSection(&local_208,log,(string *)local_1c8,&local_260);
    tcu::ScopedLogSection::~ScopedLogSection(&local_208);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_1c8);
    (*egl->_vptr_Library[0x30])
              (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
    dVar5 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar5,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x14d);
    EVar6 = eglu::CallLogWrapper::eglQuerySurface
                      (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                       (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&bufferAge);
    NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar6);
    NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x300d);
    if (bufferAge != -0x65e4) {
      poVar1 = (ostringstream *)(local_1c8 + 8);
      local_1c8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "On failure, eglQuerySurface shouldn\'t change buffer age but buffer age has been changed to "
                     );
      std::ostream::operator<<(poVar1,bufferAge);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      tcu::TestContext::setTestResult
                ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail, bufferAge shouldn\'t be changed");
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,"Test4.2",&local_265);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
               ,&local_266);
    tcu::ScopedLogSection::ScopedLogSection(&local_210,log,(string *)local_1c8,&local_260);
    tcu::ScopedLogSection::~ScopedLogSection(&local_210);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)local_1c8);
    EVar6 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                      (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                       (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
    NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar6);
    NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  }
  eglu::CallLogWrapper::~CallLogWrapper(&wrapper);
  eglu::UniqueSurface::~UniqueSurface(&dummyPbuffer);
  return STOP;
}

Assistant:

TestCase::IterateResult NotCurrentSurfaceTest::iterate (void)
{
	const int					impossibleBufferAge = -26084;
	const Library&				egl					= m_eglTestCtx.getLibrary();
	const EGLConfig				config				= getEGLConfig(egl, m_eglDisplay, SURFACETYPE_PBUFFER, false);
	const EGLint				attribList[]		=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};
	const eglu::UniqueSurface	dummyPbuffer		(egl, m_eglDisplay, egl.createPbufferSurface(m_eglDisplay, config, attribList));
	TestLog&					log					= m_testCtx.getLog();
	CallLogWrapper				wrapper				(egl, log);
	EGLint						damageRegion[]		= { 10, 10, 10, 10 };
	int							bufferAge			= impossibleBufferAge;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext));
	{
		tcu::ScopedLogSection(log, "Test2.1", "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		expectFalse(wrapper.eglQuerySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectError(EGL_BAD_SURFACE);

		if (bufferAge != impossibleBufferAge)
		{
			log << tcu::TestLog::Message << "On failure, eglQuerySurface shouldn't change buffer age but buffer age has been changed to " << bufferAge << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, bufferAge shouldn't be changed");
		}
	}
	{
		tcu::ScopedLogSection(log, "Test2.2", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	{
		tcu::ScopedLogSection(log, "Test3.1", "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		expectFalse(wrapper.eglQuerySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectError(EGL_BAD_SURFACE);

		if (bufferAge != impossibleBufferAge)
		{
			log << tcu::TestLog::Message << "On failure, eglQuerySurface shouldn't change buffer age but buffer age has been changed to " << bufferAge << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, bufferAge shouldn't be changed");
		}
	}
	{
		tcu::ScopedLogSection(log, "Test3.2", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}

	if (hasExtension(egl, m_eglDisplay, "EGL_KHR_surfaceless_context"))
	{
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext));
		{
			tcu::ScopedLogSection(log, "Test4.1", "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE");
			EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
			expectFalse(wrapper.eglQuerySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
			expectError(EGL_BAD_SURFACE);

			if (bufferAge != impossibleBufferAge)
			{
				log << tcu::TestLog::Message << "On failure, eglQuerySurface shouldn't change buffer age but buffer age has been changed to " << bufferAge << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, bufferAge shouldn't be changed");
			}
		}
		{
			tcu::ScopedLogSection(log, "Test4.2", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
			expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
			expectError(EGL_BAD_MATCH);
		}
	}

	return STOP;
}